

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

uint32_t ceilToPowerOf2(uint32_t v)

{
  uint uVar1;
  
  uVar1 = (v - 1) + (uint)(v == 0);
  uVar1 = uVar1 >> 1 | uVar1;
  uVar1 = uVar1 >> 2 | uVar1;
  uVar1 = uVar1 >> 4 | uVar1;
  uVar1 = uVar1 >> 8 | uVar1;
  return (uVar1 >> 0x10 | uVar1) + 1;
}

Assistant:

uint32_t ceilToPowerOf2(uint32_t v) {
    v += (v == 0);
    v--;
    v |= v >> 1;
    v |= v >> 2;
    v |= v >> 4;
    v |= v >> 8;
    v |= v >> 16;
    v++;
    return v;
}